

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

iterator * __thiscall
phmap::priv::
parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<int,int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,int>>>
::find<int,phmap::LockableBaseImpl<std::mutex>::WriteLock>
          (iterator *__return_storage_ptr__,
          parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<int,int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,int>>>
          *this,key_arg<int> *key,size_t hashval,WriteLock *mutexlock)

{
  pthread_mutex_t *__mutex;
  bool bVar1;
  pthread_mutex_t *__mutex_00;
  int iVar2;
  ctrl_t *pcVar3;
  long lVar4;
  iterator iVar5;
  
  lVar4 = (ulong)(((uint)(hashval >> 0x18) & 0xff ^
                  (uint)hashval >> 8 ^ (uint)(hashval >> 0x10) & 0xffff) & 0xf) * 0x58;
  __mutex = (pthread_mutex_t *)(this + lVar4);
  iVar2 = pthread_mutex_lock(__mutex);
  if (iVar2 == 0) {
    __mutex_00 = (pthread_mutex_t *)mutexlock->m_;
    mutexlock->m_ = (mutex_type *)__mutex;
    bVar1 = mutexlock->locked_;
    mutexlock->locked_ = true;
    if (bVar1 == true) {
      pthread_mutex_unlock(__mutex_00);
    }
    iVar5 = raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
            ::find<int>((raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)(this + lVar4 + 0x28),key,hashval);
    pcVar3 = (ctrl_t *)(__mutex[1].__align + *(long *)((long)__mutex + 0x40));
    if (pcVar3 == iVar5.ctrl_) {
      __return_storage_ptr__->inner_ = (Inner *)0x0;
      __return_storage_ptr__->inner_end_ = (Inner *)0x0;
      (__return_storage_ptr__->it_).ctrl_ = (ctrl_t *)0x0;
      pcVar3 = (ctrl_t *)0x0;
    }
    else {
      __return_storage_ptr__->inner_ = (Inner *)__mutex;
      __return_storage_ptr__->inner_end_ = (Inner *)(this + 0x580);
      (__return_storage_ptr__->it_).ctrl_ = iVar5.ctrl_;
      (__return_storage_ptr__->it_).field_1 = iVar5.field_1;
    }
    (__return_storage_ptr__->it_end_).ctrl_ = pcVar3;
    return __return_storage_ptr__;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

iterator find(const key_arg<K>& key, size_t hashval, L& mutexlock) {
        Inner& inner = sets_[subidx(hashval)];
        auto& set = inner.set_;
        mutexlock = std::move(L(inner));
        return make_iterator(&inner, set.find(key, hashval));
    }